

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cI16,cBGRA,bAdd>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  FSpecialColormap *pFVar4;
  EBlend EVar5;
  long lVar6;
  BYTE BVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  byte *pbVar11;
  long lVar12;
  int iVar13;
  
  pFVar4 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar5 = BLEND_NONE;
  }
  else {
    EVar5 = inf->blend;
  }
  switch(EVar5) {
  case BLEND_NONE:
    if (0 < count) {
      pbVar11 = pin + 1;
      lVar6 = 0;
      do {
        iVar10 = (int)((uint)*pbVar11 * inf->alpha + (uint)pout[lVar6 * 4 + 2] * 0x10000) >> 0x10;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pout[lVar6 * 4 + 2] = (BYTE)iVar10;
        iVar10 = (int)((uint)*pbVar11 * inf->alpha + (uint)pout[lVar6 * 4 + 1] * 0x10000) >> 0x10;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pout[lVar6 * 4 + 1] = (BYTE)iVar10;
        iVar10 = (int)((uint)*pbVar11 * inf->alpha + (uint)pout[lVar6 * 4] * 0x10000) >> 0x10;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pout[lVar6 * 4] = (BYTE)iVar10;
        pout[lVar6 * 4 + 3] = 0xff;
        lVar6 = lVar6 + 1;
        pbVar11 = pbVar11 + step;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      pbVar11 = pin + 1;
      lVar6 = 0;
      do {
        bVar1 = *pbVar11 >> 4;
        iVar10 = (int)((uint)IcePalette[bVar1][0] * inf->alpha + (uint)pout[lVar6 * 4 + 2] * 0x10000
                      ) >> 0x10;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pout[lVar6 * 4 + 2] = (BYTE)iVar10;
        iVar10 = (int)((uint)IcePalette[bVar1][1] * inf->alpha + (uint)pout[lVar6 * 4 + 1] * 0x10000
                      ) >> 0x10;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pout[lVar6 * 4 + 1] = (BYTE)iVar10;
        iVar10 = (int)((uint)IcePalette[bVar1][2] * inf->alpha + (uint)pout[lVar6 * 4] * 0x10000) >>
                 0x10;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pout[lVar6 * 4] = (BYTE)iVar10;
        pout[lVar6 * 4 + 3] = 0xff;
        lVar6 = lVar6 + 1;
        pbVar11 = pbVar11 + step;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      pbVar11 = pin + 1;
      lVar6 = 0;
      do {
        iVar13 = (uint)*pbVar11 * inf->blendcolor[3];
        iVar10 = inf->blendcolor[1];
        iVar3 = inf->blendcolor[2];
        iVar8 = ((uint)(inf->blendcolor[0] + iVar13) >> 0x10 & 0xff) * inf->alpha +
                (uint)pout[lVar6 * 4 + 2] * 0x10000;
        BVar7 = (BYTE)((uint)iVar8 >> 0x10);
        if (0xfe < iVar8 >> 0x10) {
          BVar7 = 0xff;
        }
        pout[lVar6 * 4 + 2] = BVar7;
        iVar10 = ((uint)(iVar10 + iVar13) >> 0x10 & 0xff) * inf->alpha +
                 (uint)pout[lVar6 * 4 + 1] * 0x10000;
        BVar7 = (BYTE)((uint)iVar10 >> 0x10);
        if (0xfe < iVar10 >> 0x10) {
          BVar7 = 0xff;
        }
        pout[lVar6 * 4 + 1] = BVar7;
        iVar10 = ((uint)(iVar13 + iVar3) >> 0x10 & 0xff) * inf->alpha +
                 (uint)pout[lVar6 * 4] * 0x10000;
        BVar7 = (BYTE)((uint)iVar10 >> 0x10);
        if (0xfe < iVar10 >> 0x10) {
          BVar7 = 0xff;
        }
        pout[lVar6 * 4] = BVar7;
        pout[lVar6 * 4 + 3] = 0xff;
        lVar6 = lVar6 + 1;
        pbVar11 = pbVar11 + step;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      pbVar11 = pin + 1;
      lVar6 = 0;
      do {
        bVar1 = *pbVar11;
        iVar10 = (int)((inf->blendcolor[0] * (uint)bVar1 >> 0x10 & 0xff) * inf->alpha +
                      (uint)pout[lVar6 * 4 + 2] * 0x10000) >> 0x10;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        iVar3 = inf->blendcolor[1];
        iVar8 = inf->blendcolor[2];
        pout[lVar6 * 4 + 2] = (BYTE)iVar10;
        iVar10 = (int)((iVar3 * (uint)bVar1 >> 0x10 & 0xff) * inf->alpha +
                      (uint)pout[lVar6 * 4 + 1] * 0x10000) >> 0x10;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pout[lVar6 * 4 + 1] = (BYTE)iVar10;
        iVar10 = (int)(((uint)bVar1 * iVar8 >> 0x10 & 0xff) * inf->alpha +
                      (uint)pout[lVar6 * 4] * 0x10000) >> 0x10;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pout[lVar6 * 4] = (BYTE)iVar10;
        pout[lVar6 * 4 + 3] = 0xff;
        lVar6 = lVar6 + 1;
        pbVar11 = pbVar11 + step;
      } while (count != (int)lVar6);
    }
    break;
  default:
    lVar6 = (long)inf->blend;
    if (lVar6 < 0x21) {
      if (0 < count && BLEND_ICEMAP < inf->blend) {
        pbVar11 = pin + 1;
        lVar6 = 0;
        do {
          bVar1 = *pbVar11;
          iVar10 = (int)(inf->alpha * (uint)bVar1 + (uint)pout[lVar6 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          pout[lVar6 * 4 + 2] = (BYTE)iVar10;
          iVar10 = (int)(inf->alpha * (uint)bVar1 + (uint)pout[lVar6 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          pout[lVar6 * 4 + 1] = (BYTE)iVar10;
          iVar10 = (int)((uint)bVar1 * inf->alpha + (uint)pout[lVar6 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          pout[lVar6 * 4] = (BYTE)iVar10;
          pout[lVar6 * 4 + 3] = 0xff;
          lVar6 = lVar6 + 1;
          pbVar11 = pbVar11 + step;
        } while (count != (int)lVar6);
      }
    }
    else if (0 < count) {
      pbVar11 = pin + 1;
      lVar12 = 0;
      do {
        uVar9 = (ulong)*pbVar11;
        iVar10 = (int)((uint)*(byte *)((long)pFVar4 + uVar9 * 4 + lVar6 * 0x518 + -0xa6fe) *
                       inf->alpha + (uint)pout[lVar12 * 4 + 2] * 0x10000) >> 0x10;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        bVar1 = *(byte *)((long)pFVar4 + uVar9 * 4 + lVar6 * 0x518 + -0xa700);
        bVar2 = *(byte *)((long)pFVar4 + uVar9 * 4 + lVar6 * 0x518 + -0xa6ff);
        pout[lVar12 * 4 + 2] = (BYTE)iVar10;
        iVar10 = (int)((uint)bVar2 * inf->alpha + (uint)pout[lVar12 * 4 + 1] * 0x10000) >> 0x10;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pout[lVar12 * 4 + 1] = (BYTE)iVar10;
        iVar10 = (int)((uint)bVar1 * inf->alpha + (uint)pout[lVar12 * 4] * 0x10000) >> 0x10;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pout[lVar12 * 4] = (BYTE)iVar10;
        pout[lVar12 * 4 + 3] = 0xff;
        lVar12 = lVar12 + 1;
        pbVar11 = pbVar11 + step;
      } while (count != (int)lVar12);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}